

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O3

bool __thiscall dtc::fdt::checking::checker::visit_node(checker *this,device_tree *tree,node_ptr *n)

{
  node_path *this_00;
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  pointer psVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  pointer n_00;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>> *local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  this_00 = &this->path;
  peVar5 = (n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_70,&peVar5->name,&peVar5->unit_address);
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
    operator_delete(local_70.second._M_dataplus._M_p,
                    local_70.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  iVar4 = (*this->_vptr_checker[2])(this,tree,n);
  if ((char)iVar4 == '\0') {
LAB_0011c07d:
    bVar3 = false;
  }
  else {
    peVar5 = (n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar6 = (peVar5->props).
             super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (peVar5->props).
             super__Vector_base<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_78 = (new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>> *)this_00;
    if (psVar6 != psVar1) {
      do {
        local_88 = (psVar6->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
        local_80 = (psVar6->super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_80->_M_use_count = local_80->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_80->_M_use_count = local_80->_M_use_count + 1;
          }
        }
        iVar4 = (*this->_vptr_checker[3])(this,tree,n,&local_88);
        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
        }
        if ((char)iVar4 == '\0') goto LAB_0011c07d;
        psVar6 = psVar6 + 1;
      } while (psVar6 != psVar1);
      peVar5 = (n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    psVar2 = (peVar5->children).
             super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (n_00 = (peVar5->children).
                super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                ._M_impl.super__Vector_impl_data._M_start; n_00 != psVar2; n_00 = n_00 + 1) {
      bVar3 = visit_node(this,tree,n_00);
      if (!bVar3) goto LAB_0011c07d;
    }
    __p = (this->path).
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + -1;
    (this->path).
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __p;
    __gnu_cxx::new_allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>::
    destroy<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_78,__p);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool
checker::visit_node(device_tree *tree, const node_ptr &n)
{
	path.push_back(std::make_pair(n->name, n->unit_address));
	// Check this node
	if (!check_node(tree, n))
	{
		return false;
	}
	// Now check its properties
	for (auto i=n->property_begin(), e=n->property_end() ; i!=e ; ++i)
	{
		if (!check_property(tree, n, *i))
		{
			return false;
		}
	}
	// And then recursively check the children
	for (node::child_iterator i=n->child_begin(), e=n->child_end() ; i!=e ;
	     ++i)
	{
		if (!visit_node(tree, *i))
		{
			return false;
		}
	}
	path.pop_back();
	return true;
}